

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O0

void __thiscall psy::C::ReparserTester::case0013(ReparserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<psy::C::SyntaxKind> local_209;
  SyntaxKind local_208 [4];
  iterator local_200;
  size_type local_1f8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1f0;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d8;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  ReparserTester *this_local;
  
  local_18 = "\nint x;\nint _ ()\n{\n    x * y ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nint x;\nint _ ()\n{\n    x * y ;\n}\n",&local_39);
  Expectation::Expectation(&local_1c0);
  local_208[0] = ExpressionStatement;
  local_208[1] = 0x44a;
  local_208[2] = 0x432;
  local_208[3] = 0x432;
  local_200 = local_208;
  local_1f8 = 4;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_209);
  __l._M_len = local_1f8;
  __l._M_array = local_200;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1f0,__l,&local_209);
  preamble_int_x_VarDecl(&local_1d8,&local_1f0);
  pEVar1 = Expectation::AST(&local_1c0,&local_1d8);
  Expectation::Expectation(&local_108,pEVar1);
  reparse_withSyntaxCorrelation(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d8);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1f0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_209);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ReparserTester::case0013()
{
    auto s = R"(
int x;
int _ ()
{
    x * y ;
}
)";

    reparse_withSyntaxCorrelation(
                s,
                Expectation().AST(
                    preamble_int_x_VarDecl(
                        { SyntaxKind::ExpressionStatement,
                          SyntaxKind::MultiplyExpression,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::IdentifierName })));
}